

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_casts.cpp
# Opt level: O0

unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
duckdb::ArrayBoundCastData::BindArrayToArrayCast
          (BindCastInput *input,LogicalType *source,LogicalType *target)

{
  BindCastInput *this;
  unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_> in_RDI;
  BoundCastInfo child_cast;
  LogicalType *result_child_type;
  LogicalType *source_child_type;
  vector<duckdb::BoundCastInfo,_true> child_cast_info;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> type;
  LogicalType *in_stack_ffffffffffffff98;
  LogicalType *in_stack_ffffffffffffffa0;
  BoundCastInfo *in_stack_ffffffffffffffb8;
  
  type._M_head_impl =
       (BoundCastData *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
       super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
  vector<duckdb::BoundCastInfo,_true>::vector((vector<duckdb::BoundCastInfo,_true> *)0xfcf00b);
  ArrayType::GetChildType((LogicalType *)type._M_head_impl);
  this = (BindCastInput *)ArrayType::GetChildType((LogicalType *)type._M_head_impl);
  BindCastInput::GetCastFunction(this,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  make_uniq<duckdb::ArrayBoundCastData,duckdb::BoundCastInfo>(in_stack_ffffffffffffffb8);
  unique_ptr<duckdb::BoundCastData,std::default_delete<duckdb::BoundCastData>,true>::
  unique_ptr<duckdb::ArrayBoundCastData,std::default_delete<std::unique_ptr<duckdb::BoundCastData,std::default_delete<duckdb::BoundCastData>>>,void>
            ((unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> *)
             type._M_head_impl,
             (unique_ptr<duckdb::ArrayBoundCastData,_std::default_delete<duckdb::ArrayBoundCastData>_>
              *)this);
  unique_ptr<duckdb::ArrayBoundCastData,_std::default_delete<duckdb::ArrayBoundCastData>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ArrayBoundCastData,_std::default_delete<duckdb::ArrayBoundCastData>,_true>
               *)0xfcf08a);
  BoundCastInfo::~BoundCastInfo((BoundCastInfo *)0xfcf094);
  vector<duckdb::BoundCastInfo,_true>::~vector((vector<duckdb::BoundCastInfo,_true> *)0xfcf09e);
  return (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
         (__uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
         .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<BoundCastData> ArrayBoundCastData::BindArrayToArrayCast(BindCastInput &input, const LogicalType &source,
                                                                   const LogicalType &target) {
	vector<BoundCastInfo> child_cast_info;
	auto &source_child_type = ArrayType::GetChildType(source);
	auto &result_child_type = ArrayType::GetChildType(target);
	auto child_cast = input.GetCastFunction(source_child_type, result_child_type);
	return make_uniq<ArrayBoundCastData>(std::move(child_cast));
}